

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleIntervalFunc1 *func,Interval *arg0)

{
  Interval *pIVar1;
  double dVar2;
  Interval local_48;
  Interval local_30;
  Interval *local_18;
  Interval *arg0_local;
  DoubleIntervalFunc1 *func_local;
  
  local_18 = arg0;
  arg0_local = (Interval *)func;
  dVar2 = Interval::lo(arg0);
  (*func)(&local_30,dVar2);
  pIVar1 = arg0_local;
  Interval::hi(local_18);
  (*(code *)pIVar1)(&local_48);
  Interval::Interval(__return_storage_ptr__,&local_30,&local_48);
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleIntervalFunc1& func, const Interval& arg0)
{
	return Interval(func(arg0.lo()), func(arg0.hi()));
}